

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kinematics.cc
# Opt level: O2

Vector3d *
RigidBodyDynamics::CalcBaseToBodyCoordinates
          (Vector3d *__return_storage_ptr__,Model *model,VectorNd *Q,uint body_id,
          Vector3d *point_base_coordinates,bool update_kinematics)

{
  uint uVar1;
  pointer pFVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  pointer pSVar6;
  SpatialTransform *pSVar7;
  pointer pSVar8;
  Matrix3d *pMVar9;
  undefined7 in_register_00000089;
  byte bVar10;
  Vector3d parent_body_position;
  Vector3d fixed_position;
  Vector3d body_position;
  Matrix3d parent_body_rotation;
  Matrix3d body_rotation;
  
  bVar10 = 0;
  if ((int)CONCAT71(in_register_00000089,update_kinematics) != 0) {
    UpdateKinematicsCustom(model,Q,(VectorNd *)0x0,(VectorNd *)0x0);
  }
  uVar3 = body_id - model->fixed_body_discriminator;
  if (body_id < model->fixed_body_discriminator) {
    pSVar8 = (model->X_base).
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             .
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start;
    parent_body_rotation.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
    .m_storage.m_data.array[0] = (double)&body_rotation;
    pSVar6 = pSVar8 + body_id;
    pMVar9 = (Matrix3d *)
             parent_body_rotation.super_Matrix3d.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0];
    for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
      (pMVar9->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[0] = *(double *)&(pSVar6->E).super_Matrix3d;
      pSVar6 = (pointer)((long)pSVar6 + ((ulong)bVar10 * -2 + 1) * 8);
      pMVar9 = (Matrix3d *)((long)pMVar9 + ((ulong)bVar10 * -2 + 1) * 8);
    }
    body_position.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[2] = *(double *)((long)&pSVar8[body_id].r.super_Vector3d + 0x10);
    parent_body_rotation.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
    .m_storage.m_data.array[2] = (double)&body_position;
    body_position.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[0] =
         *(double *)
          &pSVar8[body_id].r.super_Vector3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>;
    body_position.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[1] =
         *(double *)
          ((long)&pSVar8[body_id].r.super_Vector3d.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8);
    parent_body_rotation.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
    .m_storage.m_data.array[1] = (double)point_base_coordinates;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)__return_storage_ptr__,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                *)&parent_body_rotation);
  }
  else {
    pFVar2 = (model->mFixedBodies).
             super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
             .
             super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar1 = pFVar2[uVar3].mMovableParent;
    body_position.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[0] = (double)&body_rotation;
    lVar4 = 9;
    pSVar7 = &pFVar2[uVar3].mParentTransform;
    pMVar9 = (Matrix3d *)
             body_position.super_Vector3d.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
    for (lVar5 = lVar4; lVar5 != 0; lVar5 = lVar5 + -1) {
      (pMVar9->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[0] = *(double *)&(pSVar7->E).super_Matrix3d;
      pSVar7 = (SpatialTransform *)((long)pSVar7 + ((ulong)bVar10 * -2 + 1) * 8);
      pMVar9 = (Matrix3d *)((long)pMVar9 + ((ulong)bVar10 * -2 + 1) * 8);
    }
    fixed_position.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[2] = *(double *)((long)&pFVar2[uVar3].mParentTransform.r + 0x10);
    body_position.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[2] = (double)&fixed_position;
    fixed_position.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[0] =
         *(double *)
          &pFVar2[uVar3].mParentTransform.r.super_Vector3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>;
    fixed_position.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[1] = *(double *)((long)&pFVar2[uVar3].mParentTransform.r + 8);
    pSVar8 = (model->X_base).
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             .
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar1;
    pMVar9 = &parent_body_rotation;
    for (; lVar4 != 0; lVar4 = lVar4 + -1) {
      (pMVar9->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[0] = *(double *)&(pSVar8->E).super_Matrix3d;
      pSVar8 = (pointer)((long)pSVar8 + ((ulong)bVar10 * -2 + 1) * 8);
      pMVar9 = (Matrix3d *)((long)pMVar9 + ((ulong)bVar10 * -2 + 1) * 8);
    }
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>,0>const>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)__return_storage_ptr__,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>,_0>_>
                *)&body_position);
  }
  return __return_storage_ptr__;
}

Assistant:

RBDL_DLLAPI
Vector3d CalcBaseToBodyCoordinates (
		Model &model,
		const VectorNd &Q,
		unsigned int body_id,
		const Vector3d &point_base_coordinates,
		bool update_kinematics) {
	if (update_kinematics) {
		UpdateKinematicsCustom (model, &Q, NULL, NULL);
	}

	if (body_id >= model.fixed_body_discriminator) {
		unsigned int fbody_id = body_id - model.fixed_body_discriminator;
		unsigned int parent_id = model.mFixedBodies[fbody_id].mMovableParent;

		Matrix3d fixed_rotation = model.mFixedBodies[fbody_id].mParentTransform.E;
		Vector3d fixed_position = model.mFixedBodies[fbody_id].mParentTransform.r;

		Matrix3d parent_body_rotation = model.X_base[parent_id].E;
		Vector3d parent_body_position = model.X_base[parent_id].r;

		return fixed_rotation * ( - fixed_position - parent_body_rotation * (parent_body_position - point_base_coordinates));
	}

	Matrix3d body_rotation = model.X_base[body_id].E;
	Vector3d body_position = model.X_base[body_id].r;

	return body_rotation * (point_base_coordinates - body_position);
}